

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

seed_t lest::seed(text *opt,text *arg)

{
  bool bVar1;
  int iVar2;
  runtime_error *this;
  seed_t sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  text local_60;
  text local_40;
  
  std::__cxx11::string::string((string *)&local_60,(string *)arg);
  bVar1 = is_number(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_40,(string *)arg);
    iVar2 = stoi(&local_40);
    sVar3 = (seed_t)iVar2;
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    bVar1 = std::operator==(arg,"time");
    if (!bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_e0,"expecting \'time\' or positive number with option \'",opt);
      std::operator+(&local_c0,&local_e0,"\', got \'");
      std::operator+(&local_a0,&local_c0,arg);
      std::operator+(&local_80,&local_a0,"\' (try option --help)");
      std::runtime_error::runtime_error(this,(string *)&local_80);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    sVar3 = std::chrono::_V2::system_clock::now();
  }
  return sVar3;
}

Assistant:

inline seed_t seed( text opt, text arg )
{
    if ( is_number( arg ) )
        return static_cast<seed_t>( lest::stoi( arg ) );

    if ( arg == "time" )
        return static_cast<seed_t>( std::chrono::high_resolution_clock::now().time_since_epoch().count() );

    throw std::runtime_error( "expecting 'time' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}